

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O1

void __thiscall
soul::SourceCodeUtilities::findRangeOfASTObject(soul::AST::ASTObject&)::FindLexicalRangeVisitor::
visitObject(soul::AST::ASTObject__(void *this,ASTObject *o)

{
  SourceCodeText *o_00;
  char *pcVar1;
  SourceCodeText *pSVar2;
  
  ASTVisitor::visitObject((ASTVisitor *)this,o);
  o_00 = (o->context).location.sourceCode.object;
  if (o_00 != (SourceCodeText *)0x0) {
    (o_00->super_RefCountedObject).refCount = (o_00->super_RefCountedObject).refCount + 1;
  }
  pcVar1 = (o->context).location.location.data;
  if (pcVar1 < *(char **)((long)this + 0x10)) {
    if (o_00 != (SourceCodeText *)0x0) {
      (o_00->super_RefCountedObject).refCount = (o_00->super_RefCountedObject).refCount + 1;
    }
    pSVar2 = *(SourceCodeText **)((long)this + 8);
    *(SourceCodeText **)((long)this + 8) = o_00;
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar2);
    *(char **)((long)this + 0x10) = pcVar1;
  }
  if (*(char **)((long)this + 0x20) < pcVar1) {
    if (o_00 != (SourceCodeText *)0x0) {
      (o_00->super_RefCountedObject).refCount = (o_00->super_RefCountedObject).refCount + 1;
    }
    pSVar2 = *(SourceCodeText **)((long)this + 0x18);
    *(SourceCodeText **)((long)this + 0x18) = o_00;
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar2);
    *(char **)((long)this + 0x20) = pcVar1;
  }
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o_00);
  return;
}

Assistant:

void visitObject (AST::ASTObject& o) override
        {
            ASTVisitor::visitObject (o);

            auto loc = o.context.location;

            if (loc.location < range.start.location)  range.start = loc;
            if (loc.location > range.end.location)    range.end = loc;
        }